

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::cpp::CppGenerator::Generate
          (CppGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  char *nptr;
  ulong uVar7;
  string *filename;
  undefined4 extraout_var;
  pointer pZVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  LogMessage *pLVar9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  AnnotationCollector *local_c50;
  AnnotationCollector *local_c18;
  undefined1 local_b90 [8];
  Printer printer_5;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_ad0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_6;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_aa8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_5;
  Printer printer_4;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_9e0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_4;
  undefined1 local_9d0 [4];
  int i_2;
  Printer printer_3;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_910;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_3;
  int local_900;
  int i_1;
  int cc_file_number;
  int local_8bc;
  undefined1 local_8b8 [4];
  int num_cc_files;
  Printer printer_2;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_7f8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_2;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output_1;
  string local_7e0;
  undefined1 local_7c0 [8];
  Printer printer_1;
  string info_path_1;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector_1;
  GeneratedCodeInfo annotations_1;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_6a0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output_1;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output;
  string local_688;
  undefined1 local_668 [8];
  Printer printer;
  string info_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_548;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  FileGenerator file_generator;
  string basename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  _Base_ptr local_198;
  undefined1 local_190;
  value_type local_188;
  ulong local_168;
  size_t next_pos;
  size_t pos;
  undefined1 local_150 [4];
  int i;
  Options file_options;
  undefined1 local_50 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  CppGenerator *this_local;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  Options::Options((Options *)local_150);
  file_options.enforce_mode._0_1_ = this->opensource_runtime_ & kSpeed;
  std::__cxx11::string::operator=
            ((string *)&file_options.force_inline_string,(string *)&this->runtime_include_base_);
  pos._4_4_ = 0;
  do {
    uVar4 = (ulong)pos._4_4_;
    sVar5 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_50);
    if (sVar5 <= uVar4) {
      if (((file_options.dllexport_decl.field_2._M_local_buf[8] & 1U) == 0) ||
         (((undefined1)file_options.enforce_mode & kSpeed) == kNoEnforcement)) {
        filename = FileDescriptor::name_abi_cxx11_(file);
        StripProto((string *)
                   &file_generator.extension_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,filename);
        bVar1 = MaybeBootstrap((Options *)local_150,generator_context,
                               (bool)(file_options.annotate_headers & 1),
                               (string *)
                               &file_generator.extension_generators_.
                                super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar1) {
          FileGenerator::FileGenerator((FileGenerator *)&output,file,(Options *)local_150);
          if ((file_options.dllexport_decl.field_2._M_local_buf[9] & 1U) != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &annotations._cached_size_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &file_generator.extension_generators_.
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,".proto.h");
            iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                              (generator_context,&annotations._cached_size_);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
            ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                      ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                        *)&local_548,(pointer)CONCAT44(extraout_var,iVar2));
            std::__cxx11::string::~string((string *)&annotations._cached_size_);
            GeneratedCodeInfo::GeneratedCodeInfo
                      ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
            io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
            AnnotationProtoCollector
                      ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                       ((long)&info_path.field_2 + 8),
                       (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &printer.annotation_collector_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &file_generator.extension_generators_.
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,".proto.h.meta");
            pZVar8 = std::
                     unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ::get(&local_548);
            if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
              local_c18 = (AnnotationCollector *)0x0;
            }
            else {
              local_c18 = (AnnotationCollector *)((long)&info_path.field_2 + 8);
            }
            io::Printer::Printer((Printer *)local_668,pZVar8,'$',local_c18);
            info_output._M_t.
            super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl
            ._6_1_ = 0;
            if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
              std::allocator<char>::allocator();
              info_output._M_t.
              super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
              _M_head_impl._6_1_ = 1;
              std::__cxx11::string::string
                        ((string *)&local_688,"",
                         (allocator *)
                         ((long)&info_output._M_t.
                                 super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                                 ._M_head_impl + 7));
            }
            else {
              std::__cxx11::string::string
                        ((string *)&local_688,(string *)&printer.annotation_collector_);
            }
            FileGenerator::GenerateProtoHeader
                      ((FileGenerator *)&output,(Printer *)local_668,&local_688);
            std::__cxx11::string::~string((string *)&local_688);
            if ((info_output._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                 _M_head_impl._6_1_ & 1) != 0) {
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&info_output._M_t.
                                 super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                                 .
                                 super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                                 ._M_head_impl + 7));
            }
            if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) != 0) {
              iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                                (generator_context,&printer.annotation_collector_);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                        ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                          *)&output_1,(pointer)CONCAT44(extraout_var_00,iVar2));
              pZVar8 = std::
                       unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       ::get(&output_1);
              MessageLite::SerializeToZeroCopyStream
                        ((MessageLite *)&annotation_collector.annotation_proto_,pZVar8);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::~unique_ptr(&output_1);
            }
            io::Printer::~Printer((Printer *)local_668);
            std::__cxx11::string::~string((string *)&printer.annotation_collector_);
            io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
            ~AnnotationProtoCollector
                      ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                       ((long)&info_path.field_2 + 8));
            GeneratedCodeInfo::~GeneratedCodeInfo
                      ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ::~unique_ptr(&local_548);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &annotations_1._cached_size_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &file_generator.extension_generators_.
                          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,".pb.h");
          iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                            (generator_context,&annotations_1._cached_size_);
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
          ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                    ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                      *)&local_6a0,(pointer)CONCAT44(extraout_var_01,iVar2));
          std::__cxx11::string::~string((string *)&annotations_1._cached_size_);
          GeneratedCodeInfo::GeneratedCodeInfo
                    ((GeneratedCodeInfo *)&annotation_collector_1.annotation_proto_);
          io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
          AnnotationProtoCollector
                    ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                     ((long)&info_path_1.field_2 + 8),
                     (GeneratedCodeInfo *)&annotation_collector_1.annotation_proto_);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &printer_1.annotation_collector_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &file_generator.extension_generators_.
                          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,".pb.h.meta");
          pZVar8 = std::
                   unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   ::get(&local_6a0);
          if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
            local_c50 = (AnnotationCollector *)0x0;
          }
          else {
            local_c50 = (AnnotationCollector *)((long)&info_path_1.field_2 + 8);
          }
          io::Printer::Printer((Printer *)local_7c0,pZVar8,'$',local_c50);
          info_output_1._M_t.
          super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ._M_t.
          super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl.
          _6_1_ = 0;
          if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) == 0) {
            std::allocator<char>::allocator();
            info_output_1._M_t.
            super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ._M_t.
            super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl
            ._6_1_ = 1;
            std::__cxx11::string::string
                      ((string *)&local_7e0,"",
                       (allocator *)
                       ((long)&info_output_1._M_t.
                               super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                               .
                               super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                               ._M_head_impl + 7));
          }
          else {
            std::__cxx11::string::string
                      ((string *)&local_7e0,(string *)&printer_1.annotation_collector_);
          }
          FileGenerator::GeneratePBHeader((FileGenerator *)&output,(Printer *)local_7c0,&local_7e0);
          std::__cxx11::string::~string((string *)&local_7e0);
          if ((info_output_1._M_t.
               super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
               _M_head_impl._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&info_output_1._M_t.
                               super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                               .
                               super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                               ._M_head_impl + 7));
          }
          if ((file_options.dllexport_decl.field_2._M_local_buf[0xb] & 1U) != 0) {
            iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                              (generator_context,&printer_1.annotation_collector_);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
            ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                      ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                        *)&output_2,(pointer)CONCAT44(extraout_var_02,iVar2));
            pZVar8 = std::
                     unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ::get(&output_2);
            MessageLite::SerializeToZeroCopyStream
                      ((MessageLite *)&annotation_collector_1.annotation_proto_,pZVar8);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ::~unique_ptr(&output_2);
          }
          io::Printer::~Printer((Printer *)local_7c0);
          std::__cxx11::string::~string((string *)&printer_1.annotation_collector_);
          io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::
          ~AnnotationProtoCollector
                    ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)
                     ((long)&info_path_1.field_2 + 8));
          GeneratedCodeInfo::~GeneratedCodeInfo
                    ((GeneratedCodeInfo *)&annotation_collector_1.annotation_proto_);
          std::
          unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
          ::~unique_ptr(&local_6a0);
          bVar1 = UsingImplicitWeakFields(file,(Options *)local_150);
          if (bVar1) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &printer_2.annotation_collector_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &file_generator.extension_generators_.
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,".pb.cc");
            iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                              (generator_context,&printer_2.annotation_collector_);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
            ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                      ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                        *)&local_7f8,(pointer)CONCAT44(extraout_var_03,iVar2));
            std::__cxx11::string::~string((string *)&printer_2.annotation_collector_);
            pZVar8 = std::
                     unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ::get(&local_7f8);
            io::Printer::Printer((Printer *)local_8b8,pZVar8,'$');
            FileGenerator::GenerateGlobalSource((FileGenerator *)&output,(Printer *)local_8b8);
            io::Printer::~Printer((Printer *)local_8b8);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ::~unique_ptr(&local_7f8);
            iVar2 = FileGenerator::NumMessages((FileGenerator *)&output);
            local_8bc = FileGenerator::NumExtensions((FileGenerator *)&output);
            local_8bc = iVar2 + local_8bc;
            if (0 < (int)file_options.runtime_include_base.field_2._8_4_) {
              i_1._3_1_ = 0;
              if ((int)file_options.runtime_include_base.field_2._8_4_ < local_8bc) {
                internal::LogMessage::LogMessage
                          ((LogMessage *)&cc_file_number,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_generator.cc"
                           ,0xea);
                i_1._3_1_ = 1;
                pLVar9 = internal::LogMessage::operator<<
                                   ((LogMessage *)&cc_file_number,
                                    "CHECK failed: (num_cc_files) <= (file_options.num_cc_files): ")
                ;
                pLVar9 = internal::LogMessage::operator<<
                                   (pLVar9,
                                    "There must be at least as many numbered .cc files as messages and extensions."
                                   );
                internal::LogFinisher::operator=((LogFinisher *)((long)&i_1 + 2),pLVar9);
              }
              if ((i_1._3_1_ & 1) != 0) {
                internal::LogMessage::~LogMessage((LogMessage *)&cc_file_number);
              }
              local_8bc = file_options.runtime_include_base.field_2._8_4_;
            }
            local_900 = 0;
            for (output_3._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                 _M_head_impl._4_4_ = 0;
                iVar2 = output_3._M_t.
                        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                        _M_head_impl._4_4_,
                iVar3 = FileGenerator::NumMessages((FileGenerator *)&output), iVar2 < iVar3;
                output_3._M_t.
                super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                _M_head_impl._4_4_ =
                     output_3._M_t.
                     super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                     _M_head_impl._4_4_ + 1) {
              anon_unknown_5::NumberedCcFileName
                        ((string *)&printer_3.annotation_collector_,
                         (string *)
                         &file_generator.extension_generators_.
                          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_900);
              iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                                (generator_context,&printer_3.annotation_collector_);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                        ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                          *)&local_910,(pointer)CONCAT44(extraout_var_04,iVar2));
              std::__cxx11::string::~string((string *)&printer_3.annotation_collector_);
              pZVar8 = std::
                       unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       ::get(&local_910);
              io::Printer::Printer((Printer *)local_9d0,pZVar8,'$');
              FileGenerator::GenerateSourceForMessage
                        ((FileGenerator *)&output,
                         output_3._M_t.
                         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                         ._M_head_impl._4_4_,(Printer *)local_9d0);
              io::Printer::~Printer((Printer *)local_9d0);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::~unique_ptr(&local_910);
              local_900 = local_900 + 1;
            }
            for (output_4._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                 .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                 _M_head_impl._4_4_ = 0;
                iVar2 = output_4._M_t.
                        super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                        .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                        _M_head_impl._4_4_,
                iVar3 = FileGenerator::NumExtensions((FileGenerator *)&output), iVar2 < iVar3;
                output_4._M_t.
                super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                _M_head_impl._4_4_ =
                     output_4._M_t.
                     super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>.
                     _M_head_impl._4_4_ + 1) {
              anon_unknown_5::NumberedCcFileName
                        ((string *)&printer_4.annotation_collector_,
                         (string *)
                         &file_generator.extension_generators_.
                          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_900);
              iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                                (generator_context,&printer_4.annotation_collector_);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                        ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                          *)&local_9e0,(pointer)CONCAT44(extraout_var_05,iVar2));
              std::__cxx11::string::~string((string *)&printer_4.annotation_collector_);
              pZVar8 = std::
                       unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                       ::get(&local_9e0);
              io::Printer::Printer((Printer *)&output_5,pZVar8,'$');
              FileGenerator::GenerateSourceForExtension
                        ((FileGenerator *)&output,
                         output_4._M_t.
                         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                         ._M_head_impl._4_4_,(Printer *)&output_5);
              io::Printer::~Printer((Printer *)&output_5);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::~unique_ptr(&local_9e0);
              local_900 = local_900 + 1;
            }
            for (; local_900 < local_8bc; local_900 = local_900 + 1) {
              anon_unknown_5::NumberedCcFileName
                        ((string *)&output_6,
                         (string *)
                         &file_generator.extension_generators_.
                          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_900);
              iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&output_6);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
              ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                        ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                          *)&local_aa8,(pointer)CONCAT44(extraout_var_06,iVar2));
              std::__cxx11::string::~string((string *)&output_6);
              std::
              unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
              ::~unique_ptr(&local_aa8);
            }
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &printer_5.annotation_collector_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &file_generator.extension_generators_.
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,".pb.cc");
            iVar2 = (*generator_context->_vptr_GeneratorContext[2])
                              (generator_context,&printer_5.annotation_collector_);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
            ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                      ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                        *)&local_ad0,(pointer)CONCAT44(extraout_var_07,iVar2));
            std::__cxx11::string::~string((string *)&printer_5.annotation_collector_);
            pZVar8 = std::
                     unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                     ::get(&local_ad0);
            io::Printer::Printer((Printer *)local_b90,pZVar8,'$');
            FileGenerator::GenerateSource((FileGenerator *)&output,(Printer *)local_b90);
            io::Printer::~Printer((Printer *)local_b90);
            std::
            unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
            ::~unique_ptr(&local_ad0);
          }
          FileGenerator::~FileGenerator((FileGenerator *)&output);
        }
        this_local._7_1_ = true;
        std::__cxx11::string::~string
                  ((string *)
                   &file_generator.extension_generators_.
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)
                   options.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   "The safe_boundary_check option is not supported outside of Google.");
        this_local._7_1_ = false;
      }
LAB_00456e29:
      Options::~Options((Options *)local_150);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_50);
      return this_local._7_1_;
    }
    pvVar6 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,(long)pos._4_4_);
    bVar1 = std::operator==(&pvVar6->first,"dllexport_decl");
    if (bVar1) {
      pvVar6 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)pos._4_4_);
      std::__cxx11::string::operator=((string *)local_150,(string *)&pvVar6->second);
    }
    else {
      pvVar6 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)pos._4_4_);
      bVar1 = std::operator==(&pvVar6->first,"safe_boundary_check");
      if (bVar1) {
        file_options.dllexport_decl.field_2._M_local_buf[8] = '\x01';
      }
      else {
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_50,(long)pos._4_4_);
        bVar1 = std::operator==(&pvVar6->first,"annotate_headers");
        if (bVar1) {
          file_options.dllexport_decl.field_2._M_local_buf[0xb] = '\x01';
        }
        else {
          pvVar6 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_50,(long)pos._4_4_);
          bVar1 = std::operator==(&pvVar6->first,"annotation_pragma_name");
          if (bVar1) {
            pvVar6 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_50,(long)pos._4_4_);
            std::__cxx11::string::operator=
                      ((string *)&file_options.num_cc_files,(string *)&pvVar6->second);
          }
          else {
            pvVar6 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_50,(long)pos._4_4_);
            bVar1 = std::operator==(&pvVar6->first,"annotation_guard_name");
            if (bVar1) {
              pvVar6 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_50,(long)pos._4_4_);
              std::__cxx11::string::operator=
                        ((string *)(file_options.annotation_pragma_name.field_2._M_local_buf + 8),
                         (string *)&pvVar6->second);
            }
            else {
              pvVar6 = std::
                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_50,(long)pos._4_4_);
              bVar1 = std::operator==(&pvVar6->first,"speed");
              if (bVar1) {
                file_options.dllexport_decl.field_2._12_4_ = 1;
              }
              else {
                pvVar6 = std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_50,(long)pos._4_4_);
                bVar1 = std::operator==(&pvVar6->first,"code_size");
                if (bVar1) {
                  file_options.dllexport_decl.field_2._12_4_ = 2;
                }
                else {
                  pvVar6 = std::
                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_50,(long)pos._4_4_);
                  bVar1 = std::operator==(&pvVar6->first,"lite");
                  if (bVar1) {
                    file_options.dllexport_decl.field_2._12_4_ = 3;
                  }
                  else {
                    pvVar6 = std::
                             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_50,(long)pos._4_4_);
                    bVar1 = std::operator==(&pvVar6->first,"lite_implicit_weak_fields");
                    if (bVar1) {
                      file_options.dllexport_decl.field_2._12_4_ = 3;
                      file_options.transitive_pb_h = true;
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_50,(long)pos._4_4_);
                      uVar4 = std::__cxx11::string::empty();
                      if ((uVar4 & 1) == 0) {
                        std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_50,(long)pos._4_4_);
                        nptr = (char *)std::__cxx11::string::c_str();
                        file_options.runtime_include_base.field_2._8_4_ =
                             strto32(nptr,(char **)0x0,10);
                      }
                    }
                    else {
                      pvVar6 = std::
                               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_50,(long)pos._4_4_);
                      bVar1 = std::operator==(&pvVar6->first,"annotate_accessor");
                      if (bVar1) {
                        file_options.enforce_mode._1_1_ = 1;
                      }
                      else {
                        pvVar6 = std::
                                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)local_50,(long)pos._4_4_);
                        bVar1 = std::operator==(&pvVar6->first,"inject_field_listener_events");
                        if (bVar1) {
                          file_options.tctable_mode._0_1_ = kTCTableGuarded;
                        }
                        else {
                          pvVar6 = std::
                                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)local_50,(long)pos._4_4_);
                          bVar1 = std::operator==(&pvVar6->first,"forbidden_field_listener_events");
                          if (bVar1) {
                            next_pos = 0;
                            do {
                              pvVar6 = std::
                                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                              local_168 = std::__cxx11::string::find_first_of
                                                    ((char *)&pvVar6->second,0x76ce97);
                              if (local_168 == 0xffffffffffffffff) {
                                std::
                                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                              *)local_50,(long)pos._4_4_);
                                local_168 = std::__cxx11::string::size();
                              }
                              if (next_pos < local_168) {
                                pvVar6 = std::
                                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                std::__cxx11::string::substr
                                          ((ulong)&local_188,(ulong)&pvVar6->second);
                                pVar10 = std::
                                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::insert((
                                                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&file_options.field_listener_options,&local_188)
                                ;
                                local_198 = (_Base_ptr)pVar10.first._M_node;
                                local_190 = pVar10.second;
                                std::__cxx11::string::~string((string *)&local_188);
                              }
                              uVar4 = local_168 + 1;
                              next_pos = uVar4;
                              std::
                              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)local_50,(long)pos._4_4_);
                              uVar7 = std::__cxx11::string::size();
                            } while (uVar4 < uVar7);
                          }
                          else {
                            pvVar6 = std::
                                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                            bVar1 = std::operator==(&pvVar6->first,"eagerly_verified_lazy");
                            if (bVar1) {
                              file_options.field_listener_options.forbidden_field_listener_events.
                              _M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
                            }
                            else {
                              pvVar6 = std::
                                       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                              bVar1 = std::operator==(&pvVar6->first,"force_eagerly_verified_lazy");
                              if (bVar1) {
                                file_options.field_listener_options.forbidden_field_listener_events.
                                _M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = 1;
                              }
                              else {
                                pvVar6 = std::
                                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                bVar1 = std::operator==(&pvVar6->first,"table_driven_parsing");
                                if (bVar1) {
                                  file_options.safe_boundary_check = true;
                                }
                                else {
                                  pvVar6 = std::
                                           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                  bVar1 = std::operator==(&pvVar6->first,
                                                          "table_driven_serialization");
                                  if (bVar1) {
                                    file_options.proto_h = true;
                                  }
                                  else {
                                    pvVar6 = std::
                                             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                    bVar1 = std::operator==(&pvVar6->first,
                                                            "experimental_tail_call_table_mode");
                                    if (!bVar1) {
                                      pvVar6 = std::
                                               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                      std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&basename.field_2 + 8),
                                                  "Unknown generator option: ",&pvVar6->first);
                                      std::__cxx11::string::operator=
                                                ((string *)
                                                 options.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                                 (string *)(basename.field_2._M_local_buf + 8));
                                      std::__cxx11::string::~string
                                                ((string *)(basename.field_2._M_local_buf + 8));
                                      this_local._7_1_ = false;
                                      goto LAB_00456e29;
                                    }
                                    pvVar6 = std::
                                             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                    bVar1 = std::operator==(&pvVar6->second,"never");
                                    if (bVar1) {
                                      file_options.access_info_map._0_4_ = 0;
                                    }
                                    else {
                                      pvVar6 = std::
                                               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                      bVar1 = std::operator==(&pvVar6->second,"guarded");
                                      if (bVar1) {
                                        file_options.access_info_map._0_4_ = 1;
                                      }
                                      else {
                                        pvVar6 = std::
                                                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                        bVar1 = std::operator==(&pvVar6->second,"always");
                                        if (!bVar1) {
                                          pvVar6 = std::
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[]((
                                                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_50,(long)pos._4_4_);
                                          std::operator+(&local_1b8,
                                                                                                                  
                                                  "Unknown value for experimental_tail_call_table_mode: "
                                                  ,&pvVar6->second);
                                          std::__cxx11::string::operator=
                                                    ((string *)
                                                     options.
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ,(string *)&local_1b8);
                                          std::__cxx11::string::~string((string *)&local_1b8);
                                          this_local._7_1_ = false;
                                          goto LAB_00456e29;
                                        }
                                        file_options.access_info_map._0_4_ = 2;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    pos._4_4_ = pos._4_4_ + 1;
  } while( true );
}

Assistant:

bool CppGenerator::Generate(const FileDescriptor* file,
                            const std::string& parameter,
                            GeneratorContext* generator_context,
                            std::string* error) const {
  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cpp_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  //
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;
  file_options.runtime_include_base = runtime_include_base_;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else if (options[i].first == "annotate_headers") {
      file_options.annotate_headers = true;
    } else if (options[i].first == "annotation_pragma_name") {
      file_options.annotation_pragma_name = options[i].second;
    } else if (options[i].first == "annotation_guard_name") {
      file_options.annotation_guard_name = options[i].second;
    } else if (options[i].first == "speed") {
      file_options.enforce_mode = EnforceOptimizeMode::kSpeed;
    } else if (options[i].first == "code_size") {
      file_options.enforce_mode = EnforceOptimizeMode::kCodeSize;
    } else if (options[i].first == "lite") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
    } else if (options[i].first == "lite_implicit_weak_fields") {
      file_options.enforce_mode = EnforceOptimizeMode::kLiteRuntime;
      file_options.lite_implicit_weak_fields = true;
      if (!options[i].second.empty()) {
        file_options.num_cc_files =
            strto32(options[i].second.c_str(), NULL, 10);
      }
    } else if (options[i].first == "annotate_accessor") {
      file_options.annotate_accessor = true;
    } else if (options[i].first == "inject_field_listener_events") {
      file_options.field_listener_options.inject_field_listener_events = true;
    } else if (options[i].first == "forbidden_field_listener_events") {
      std::size_t pos = 0;
      do {
        std::size_t next_pos = options[i].second.find_first_of("+", pos);
        if (next_pos == std::string::npos) {
          next_pos = options[i].second.size();
        }
        if (next_pos > pos)
          file_options.field_listener_options.forbidden_field_listener_events
              .insert(options[i].second.substr(pos, next_pos - pos));
        pos = next_pos + 1;
      } while (pos < options[i].second.size());
    } else if (options[i].first == "eagerly_verified_lazy") {
      file_options.eagerly_verified_lazy = true;
    } else if (options[i].first == "force_eagerly_verified_lazy") {
      file_options.force_eagerly_verified_lazy = true;
    } else if (options[i].first == "table_driven_parsing") {
      file_options.table_driven_parsing = true;
    } else if (options[i].first == "table_driven_serialization") {
      file_options.table_driven_serialization = true;
    } else if (options[i].first == "experimental_tail_call_table_mode") {
      if (options[i].second == "never") {
        file_options.tctable_mode = Options::kTCTableNever;
      } else if (options[i].second == "guarded") {
        file_options.tctable_mode = Options::kTCTableGuarded;
      } else if (options[i].second == "always") {
        file_options.tctable_mode = Options::kTCTableAlways;
      } else {
        *error = "Unknown value for experimental_tail_call_table_mode: " +
                 options[i].second;
        return false;
      }
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // The safe_boundary_check option controls behavior for Google-internal
  // protobuf APIs.
  if (file_options.safe_boundary_check && file_options.opensource_runtime) {
    *error =
        "The safe_boundary_check option is not supported outside of Google.";
    return false;
  }

  // -----------------------------------------------------------------


  std::string basename = StripProto(file->name());

  if (MaybeBootstrap(file_options, generator_context, file_options.bootstrap,
                     &basename)) {
    return true;
  }

  FileGenerator file_generator(file, file_options);

  // Generate header(s).
  if (file_options.proto_h) {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".proto.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".proto.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GenerateProtoHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::string info_path = basename + ".pb.h.meta";
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_headers ? &annotation_collector : NULL);
    file_generator.GeneratePBHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  // Generate cc file(s).
  if (UsingImplicitWeakFields(file, file_options)) {
    {
      // This is the global .cc file, containing
      // enum/services/tables/reflection
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          generator_context->Open(basename + ".pb.cc"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateGlobalSource(&printer);
    }

    int num_cc_files =
        file_generator.NumMessages() + file_generator.NumExtensions();

    // If we're using implicit weak fields then we allow the user to
    // optionally specify how many files to generate, not counting the global
    // pb.cc file. If we have more files than messages, then some files will
    // be generated as empty placeholders.
    if (file_options.num_cc_files > 0) {
      GOOGLE_CHECK_LE(num_cc_files, file_options.num_cc_files)
          << "There must be at least as many numbered .cc files as messages "
             "and extensions.";
      num_cc_files = file_options.num_cc_files;
    }
    int cc_file_number = 0;
    for (int i = 0; i < file_generator.NumMessages(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForMessage(i, &printer);
    }
    for (int i = 0; i < file_generator.NumExtensions(); i++) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number++)));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSourceForExtension(i, &printer);
    }
    // Create empty placeholder files if necessary to match the expected number
    // of files.
    for (; cc_file_number < num_cc_files; ++cc_file_number) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(generator_context->Open(
          NumberedCcFileName(basename, cc_file_number)));
    }
  } else {
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".pb.cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}